

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationrootelements.cpp
# Opt level: O0

uint32_t __thiscall
icu_63::CollationRootElements::getPrimaryAfter
          (CollationRootElements *this,uint32_t p,int32_t index,UBool isCompressible)

{
  uint offset;
  uint local_28;
  int32_t step;
  uint32_t q;
  UBool isCompressible_local;
  int32_t index_local;
  uint32_t p_local;
  CollationRootElements *this_local;
  
  q = index + 1;
  local_28 = this->elements[(int)q];
  if (((local_28 & 0x80) == 0) && (offset = local_28 & 0x7f, offset != 0)) {
    if ((p & 0xffff) == 0) {
      this_local._4_4_ = Collation::incTwoBytePrimaryByOffset(p,isCompressible,offset);
    }
    else {
      this_local._4_4_ = Collation::incThreeBytePrimaryByOffset(p,isCompressible,offset);
    }
  }
  else {
    while ((local_28 & 0x80) != 0) {
      q = q + 1;
      local_28 = this->elements[(int)q];
    }
    this_local._4_4_ = local_28;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t
CollationRootElements::getPrimaryAfter(uint32_t p, int32_t index, UBool isCompressible) const {
    U_ASSERT(p == (elements[index] & 0xffffff00) || isEndOfPrimaryRange(elements[index + 1]));
    uint32_t q = elements[++index];
    int32_t step;
    if((q & SEC_TER_DELTA_FLAG) == 0 && (step = (int32_t)q & PRIMARY_STEP_MASK) != 0) {
        // Return the next primary in this range.
        if((p & 0xffff) == 0) {
            return Collation::incTwoBytePrimaryByOffset(p, isCompressible, step);
        } else {
            return Collation::incThreeBytePrimaryByOffset(p, isCompressible, step);
        }
    } else {
        // Return the next primary in the list.
        while((q & SEC_TER_DELTA_FLAG) != 0) {
            q = elements[++index];
        }
        U_ASSERT((q & PRIMARY_STEP_MASK) == 0);
        return q;
    }
}